

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  ushort *puVar10;
  char *pcVar11;
  ushort *puVar12;
  string *psVar13;
  undefined8 uVar14;
  uint *puVar15;
  undefined8 uVar16;
  Arena *arena;
  undefined8 uVar17;
  long *plVar18;
  ushort *local_50 [2];
  long local_40;
  long local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  uVar1 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar15 & 3) != 0) {
      AlignFail(puVar15);
    }
    *puVar15 = *puVar15 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar18 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar18 & 7) != 0) {
    AlignFail(plVar18);
  }
  lVar4 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar18 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar8 = ClassData::New(*(ClassData **)(lVar4 + 0x20),arena);
    *plVar18 = (long)pMVar8;
  }
  iVar2 = ctx->depth_;
  local_38 = (long)iVar2 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar2 < 1) {
    puVar10 = (ushort *)0x0;
  }
  else {
    local_50[0] = (ushort *)(ptr + 2);
    local_40 = (long)ctx->group_depth_ + 1;
    ctx->group_depth_ = (int)local_40;
    lVar5 = *plVar18;
    while (bVar6 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_50,ctx->group_depth_),
          !bVar6) {
      uVar7 = (uint)*(byte *)(lVar4 + 8) & (uint)*local_50[0];
      if ((uVar7 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar9 = (ulong)(uVar7 & 0xfffffff8);
      local_50[0] = (ushort *)
                    (**(code **)(lVar4 + 0x38 + uVar9 * 2))
                              (lVar5,local_50[0],ctx,
                               (ulong)*local_50[0] ^ *(ulong *)(lVar4 + 0x40 + uVar9 * 2),lVar4,0);
      if ((local_50[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar12 = local_50[0];
    if ((*(byte *)(lVar4 + 9) & 1) != 0) {
      puVar12 = (ushort *)(**(code **)(lVar4 + 0x28))(lVar5,local_50[0],ctx);
    }
    if (puVar12 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        psVar13 = (string *)0x0;
      }
      else {
        psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar13 != (string *)0x0) {
        uVar17 = *(undefined8 *)psVar13;
        uVar14 = *(undefined8 *)(psVar13 + 8);
        uVar16 = 0x45b;
LAB_002924ce:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar16,uVar14,uVar17);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_50);
      }
      if ((int)local_40 == ctx->group_depth_) {
        psVar13 = (string *)0x0;
      }
      else {
        psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (local_40,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (psVar13 != (string *)0x0) {
        uVar17 = *(undefined8 *)psVar13;
        uVar14 = *(undefined8 *)(psVar13 + 8);
        uVar16 = 0x45c;
        goto LAB_002924ce;
      }
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar10 = (ushort *)0x0;
    if (uVar3 == (int)(char)uVar1 + (uint)uVar1 >> 1) {
      puVar10 = puVar12;
    }
  }
  return (char *)puVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}